

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLCOLORMASKINDEXEDEXTPROC epoxy_glColorMaskIndexedEXT_resolver(void)

{
  PFNGLCOLORMASKINDEXEDEXTPROC p_Var1;
  
  p_Var1 = (PFNGLCOLORMASKINDEXEDEXTPROC)
           gl_provider_resolver
                     ("glColorMaskIndexedEXT",epoxy_glColorMaskIndexedEXT_resolver::providers,
                      epoxy_glColorMaskIndexedEXT_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLCOLORMASKINDEXEDEXTPROC
epoxy_glColorMaskIndexedEXT_resolver(void)
{
    static const enum gl_provider providers[] = {
        GL_extension_GL_EXT_draw_buffers2,
        Desktop_OpenGL_3_0,
        GL_extension_GL_EXT_draw_buffers_indexed,
        GL_extension_GL_OES_draw_buffers_indexed,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        5041 /* "glColorMaskIndexedEXT" */,
        5063 /* "glColorMaski" */,
        5076 /* "glColorMaskiEXT" */,
        5092 /* "glColorMaskiOES" */,
    };
    return gl_provider_resolver(entrypoint_strings + 5041 /* "glColorMaskIndexedEXT" */,
                                providers, entrypoints);
}